

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

string * __thiscall
Diligent::
FormatString<char[33],char[10],unsigned_int,char[14],unsigned_long,char[22],unsigned_int,char[45]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [33],char (*Args_1) [10],
          uint *Args_2,char (*Args_3) [14],unsigned_long *Args_4,char (*Args_5) [22],uint *Args_6,
          char (*Args_7) [45])

{
  stringstream ss;
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[33],char[10],unsigned_int,char[14],unsigned_long,char[22],unsigned_int,char[45]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [33])this,(char (*) [10])Args,(uint *)Args_1,(char (*) [14])Args_2,
             (unsigned_long *)Args_3,(char (*) [22])Args_4,(uint *)Args_5,(char (*) [45])Args_6);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}